

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

uint64_t filemgr_get_bcache_used_space(void)

{
  uint64_t uVar1;
  
  if (global_config.ncacheblock != 0) {
    uVar1 = bcache_get_num_free_blocks();
    return (long)global_config.blocksize * ((long)global_config.ncacheblock - uVar1);
  }
  return 0;
}

Assistant:

uint64_t filemgr_get_bcache_used_space(void)
{
    uint64_t bcache_free_space = 0;
    if (global_config.ncacheblock) { // If buffer cache is indeed configured
        bcache_free_space = bcache_get_num_free_blocks();
        bcache_free_space = (global_config.ncacheblock - bcache_free_space)
                          * global_config.blocksize;
    }
    return bcache_free_space;
}